

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int mem_equal(void *_x,void *_y,size_t len)

{
  uint8_t t;
  uint8_t *y;
  uint8_t *x;
  size_t len_local;
  void *_y_local;
  void *_x_local;
  
  t = '\0';
  y = (uint8_t *)_y;
  x = (uint8_t *)_x;
  for (len_local = len; len_local != 0; len_local = len_local - 1) {
    t = t | *x ^ *y;
    y = y + 1;
    x = x + 1;
  }
  return (int)(t == '\0');
}

Assistant:

static int mem_equal(const void *_x, const void *_y, size_t len)
{
    const volatile uint8_t *x = _x, *y = _y;
    uint8_t t = 0;

    for (; len != 0; --len)
        t |= *x++ ^ *y++;

    return t == 0;
}